

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalGenerator::IsExcluded
          (cmGlobalGenerator *this,cmLocalGenerator *root,cmGeneratorTarget *target)

{
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  cmLocalGenerator *gen;
  string local_48;
  
  TVar3 = cmGeneratorTarget::GetType(target);
  bVar2 = true;
  if (TVar3 != INTERFACE_LIBRARY) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EXCLUDE_FROM_ALL","");
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) {
      gen = cmGeneratorTarget::GetLocalGenerator(target);
      bVar2 = IsExcluded((cmGlobalGenerator *)target,root,gen);
    }
  }
  return bVar2;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   cmGeneratorTarget* target) const
{
  if(target->GetType() == cmState::INTERFACE_LIBRARY
      || target->GetPropertyAsBool("EXCLUDE_FROM_ALL"))
    {
    // This target is excluded from its directory.
    return true;
    }
  // This target is included in its directory.  Check whether the
  // directory is excluded.
  return this->IsExcluded(root, target->GetLocalGenerator());
}